

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UCIAdapter.cpp
# Opt level: O0

void __thiscall senjo::UCIAdapter::UCICommand(UCIAdapter *this,char *params)

{
  size_t *this_00;
  bool bVar1;
  int iVar2;
  uint uVar3;
  Output *pOVar4;
  long lVar5;
  pointer pEVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  reference x;
  Output local_220;
  Output local_218;
  Output local_210;
  Output local_208;
  Output local_200;
  _Self local_1f8;
  _Base_ptr local_1f0;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  const_iterator val;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *comboValues;
  long local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8 [32];
  string local_1a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168 [32];
  Output local_148;
  Output out;
  _List_const_iterator<senjo::EngineOption> local_138;
  iterator local_130;
  _List_const_iterator<senjo::EngineOption> local_128;
  _List_const_iterator<senjo::EngineOption> local_120;
  const_iterator opt;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110 [8];
  string country;
  Output local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8 [8];
  string email;
  Output local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [8];
  string author;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [39];
  char local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  Output local_58;
  undefined1 local_50 [8];
  list<senjo::EngineOption,_std::allocator<senjo::EngineOption>_> opts;
  Output local_20;
  char *local_18;
  char *params_local;
  UCIAdapter *this_local;
  
  local_18 = params;
  params_local = (char *)this;
  bVar1 = ParamMatch((string *)token::Help_abi_cxx11_,&local_18);
  if (bVar1) {
    Output::Output(&local_20,InfoPrefix);
    pOVar4 = Output::operator<<(&local_20,(char (*) [8])"usage: ");
    Output::operator<<(pOVar4,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              token::Uci_abi_cxx11_);
    Output::~Output(&local_20);
    this_00 = &opts.super__List_base<senjo::EngineOption,_std::allocator<senjo::EngineOption>_>.
               _M_impl._M_node._M_size;
    Output::Output((Output *)this_00,InfoPrefix);
    Output::operator<<((Output *)this_00,
                       (char (*) [50])"Output engine info and options followed by uciok.");
    Output::~Output((Output *)
                    &opts.
                     super__List_base<senjo::EngineOption,_std::allocator<senjo::EngineOption>_>.
                     _M_impl._M_node._M_size);
  }
  else {
    (*this->engine->_vptr_ChessEngine[5])(local_50);
    Output::Output(&local_58,NoPrefix);
    pOVar4 = Output::operator<<(&local_58,(char (*) [9])"id name ");
    (**this->engine->_vptr_ChessEngine)(local_78);
    pOVar4 = Output::operator<<(pOVar4,local_78);
    local_79 = ' ';
    pOVar4 = Output::operator<<(pOVar4,&local_79);
    (*this->engine->_vptr_ChessEngine[1])(local_a0);
    Output::operator<<(pOVar4,local_a0);
    std::__cxx11::string::~string((string *)local_a0);
    std::__cxx11::string::~string((string *)local_78);
    Output::~Output(&local_58);
    (*this->engine->_vptr_ChessEngine[2])(local_c0);
    lVar5 = std::__cxx11::string::size();
    if (lVar5 != 0) {
      Output::Output(&local_c8,NoPrefix);
      pOVar4 = Output::operator<<(&local_c8,(char (*) [11])"id author ");
      Output::operator<<(pOVar4,local_c0);
      Output::~Output(&local_c8);
    }
    (*this->engine->_vptr_ChessEngine[3])(local_e8);
    lVar5 = std::__cxx11::string::size();
    if (lVar5 != 0) {
      Output::Output(&local_f0,NoPrefix);
      pOVar4 = Output::operator<<(&local_f0,(char (*) [10])"id email ");
      Output::operator<<(pOVar4,local_e8);
      Output::~Output(&local_f0);
    }
    (*this->engine->_vptr_ChessEngine[4])(local_110);
    lVar5 = std::__cxx11::string::size();
    if (lVar5 != 0) {
      Output::Output((Output *)&opt,NoPrefix);
      pOVar4 = Output::operator<<((Output *)&opt,(char (*) [12])"id country ");
      Output::operator<<(pOVar4,local_110);
      Output::~Output((Output *)&opt);
    }
    std::_List_const_iterator<senjo::EngineOption>::_List_const_iterator(&local_120);
    local_130._M_node =
         (_List_node_base *)
         std::__cxx11::list<senjo::EngineOption,_std::allocator<senjo::EngineOption>_>::begin
                   ((list<senjo::EngineOption,_std::allocator<senjo::EngineOption>_> *)local_50);
    std::_List_const_iterator<senjo::EngineOption>::_List_const_iterator(&local_128,&local_130);
    local_120._M_node = local_128._M_node;
    while( true ) {
      out._vptr_Output =
           (_func_int **)
           std::__cxx11::list<senjo::EngineOption,_std::allocator<senjo::EngineOption>_>::end
                     ((list<senjo::EngineOption,_std::allocator<senjo::EngineOption>_> *)local_50);
      std::_List_const_iterator<senjo::EngineOption>::_List_const_iterator
                (&local_138,(iterator *)&out);
      bVar1 = std::operator!=(&local_120,&local_138);
      if (!bVar1) break;
      Output::Output(&local_148,NoPrefix);
      pOVar4 = Output::operator<<(&local_148,(char (*) [13])"option name ");
      pEVar6 = std::_List_const_iterator<senjo::EngineOption>::operator->(&local_120);
      (*pEVar6->_vptr_EngineOption[1])(local_168);
      pOVar4 = Output::operator<<(pOVar4,local_168);
      pOVar4 = Output::operator<<(pOVar4,(char (*) [7])" type ");
      pEVar6 = std::_List_const_iterator<senjo::EngineOption>::operator->(&local_120);
      (**pEVar6->_vptr_EngineOption)(local_188);
      Output::operator<<(pOVar4,local_188);
      std::__cxx11::string::~string((string *)local_188);
      std::__cxx11::string::~string((string *)local_168);
      pEVar6 = std::_List_const_iterator<senjo::EngineOption>::operator->(&local_120);
      (*pEVar6->_vptr_EngineOption[4])(local_1a8);
      lVar5 = std::__cxx11::string::size();
      std::__cxx11::string::~string(local_1a8);
      if (lVar5 != 0) {
        pOVar4 = Output::operator<<(&local_148,(char (*) [10])" default ");
        pEVar6 = std::_List_const_iterator<senjo::EngineOption>::operator->(&local_120);
        (*pEVar6->_vptr_EngineOption[4])(local_1c8);
        Output::operator<<(pOVar4,local_1c8);
        std::__cxx11::string::~string((string *)local_1c8);
      }
      pEVar6 = std::_List_const_iterator<senjo::EngineOption>::operator->(&local_120);
      iVar2 = (*pEVar6->_vptr_EngineOption[6])();
      if (-0x8000000000000000 < CONCAT44(extraout_var,iVar2)) {
        pOVar4 = Output::operator<<(&local_148,(char (*) [6])" min ");
        pEVar6 = std::_List_const_iterator<senjo::EngineOption>::operator->(&local_120);
        iVar2 = (*pEVar6->_vptr_EngineOption[6])();
        local_1d0 = CONCAT44(extraout_var_00,iVar2);
        Output::operator<<(pOVar4,&local_1d0);
      }
      pEVar6 = std::_List_const_iterator<senjo::EngineOption>::operator->(&local_120);
      iVar2 = (*pEVar6->_vptr_EngineOption[7])();
      if (CONCAT44(extraout_var_01,iVar2) < 0x7fffffffffffffff) {
        pOVar4 = Output::operator<<(&local_148,(char (*) [6])" max ");
        pEVar6 = std::_List_const_iterator<senjo::EngineOption>::operator->(&local_120);
        iVar2 = (*pEVar6->_vptr_EngineOption[7])();
        comboValues = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT44(extraout_var_02,iVar2);
        Output::operator<<(pOVar4,(long *)&comboValues);
      }
      pEVar6 = std::_List_const_iterator<senjo::EngineOption>::operator->(&local_120);
      iVar2 = (*pEVar6->_vptr_EngineOption[8])();
      val._M_node = (_Base_ptr)CONCAT44(extraout_var_03,iVar2);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_Rb_tree_const_iterator(&local_1e8);
      local_1f0 = (_Base_ptr)
                  std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::begin(val._M_node);
      local_1e8._M_node = local_1f0;
      while( true ) {
        local_1f8._M_node =
             (_Base_ptr)
             std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(val._M_node);
        bVar1 = std::operator!=(&local_1e8,&local_1f8);
        if (!bVar1) break;
        pOVar4 = Output::operator<<(&local_148,(char (*) [6])" var ");
        x = std::
            _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator*(&local_1e8);
        Output::operator<<(pOVar4,x);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&local_1e8);
      }
      Output::~Output(&local_148);
      std::_List_const_iterator<senjo::EngineOption>::operator++(&local_120);
    }
    Output::Output(&local_200,NoPrefix);
    Output::operator<<(&local_200,(char (*) [6])"uciok");
    Output::~Output(&local_200);
    uVar3 = (*this->engine->_vptr_ChessEngine[0x17])();
    if ((uVar3 & 1) != 0) {
      Output::Output(&local_208,NoPrefix);
      Output::operator<<(&local_208,(char (*) [24])"copyprotection checking");
      Output::~Output(&local_208);
      uVar3 = (*this->engine->_vptr_ChessEngine[0x18])();
      if ((uVar3 & 1) == 0) {
        Output::Output(&local_218,NoPrefix);
        Output::operator<<(&local_218,(char (*) [21])"copyprotection error");
        Output::~Output(&local_218);
      }
      else {
        Output::Output(&local_210,NoPrefix);
        Output::operator<<(&local_210,(char (*) [18])"copyprotection ok");
        Output::~Output(&local_210);
      }
    }
    uVar3 = (*this->engine->_vptr_ChessEngine[0x14])();
    if ((uVar3 & 1) == 0) {
      Output::Output(&local_220,NoPrefix);
      Output::operator<<(&local_220,(char (*) [19])"registration error");
      Output::~Output(&local_220);
    }
    std::__cxx11::string::~string((string *)local_110);
    std::__cxx11::string::~string((string *)local_e8);
    std::__cxx11::string::~string((string *)local_c0);
    std::__cxx11::list<senjo::EngineOption,_std::allocator<senjo::EngineOption>_>::~list
              ((list<senjo::EngineOption,_std::allocator<senjo::EngineOption>_> *)local_50);
  }
  return;
}

Assistant:

void UCIAdapter::UCICommand(const char* params)
{
  if (ParamMatch(token::Help, params)) {
    Output() << "usage: " << token::Uci;
    Output() << "Output engine info and options followed by uciok.";
    return;
  }

  std::list<EngineOption> opts = engine->GetOptions();
  Output(Output::NoPrefix) << "id name " << engine->GetEngineName()
                           << ' ' << engine->GetEngineVersion();

  const std::string author = engine->GetAuthorName();
  if (author.size()) {
    Output(Output::NoPrefix) << "id author " << author;
  }

  const std::string email = engine->GetEmailAddress();
  if (email.size()) {
    Output(Output::NoPrefix) << "id email " << email;
  }

  const std::string country = engine->GetCountryName();
  if (country.size()) {
    Output(Output::NoPrefix) << "id country " << country;
  }

  std::list<EngineOption>::const_iterator opt;
  for (opt = opts.begin(); opt != opts.end(); ++opt) {
    Output out(Output::NoPrefix);
    out << "option name " << opt->GetName() << " type " << opt->GetTypeName();
    if (opt->GetDefaultValue().size()) {
      out << " default " << opt->GetDefaultValue();
    }
    if (opt->GetMinValue() > INT64_MIN) {
      out << " min " << opt->GetMinValue();
    }
    if (opt->GetMaxValue() < INT64_MAX) {
      out << " max " << opt->GetMaxValue();
    }
    const std::set<std::string>& comboValues = opt->GetComboValues();
    std::set<std::string>::const_iterator val;
    for (val = comboValues.begin(); val != comboValues.end(); ++val) {
      out << " var " << *val;
    }
  }

  Output(Output::NoPrefix) << "uciok";

  if (engine->IsCopyProtected()) {
    Output(Output::NoPrefix) << "copyprotection checking";
    if (engine->CopyIsOK()) {
      Output(Output::NoPrefix) << "copyprotection ok";
    }
    else {
      Output(Output::NoPrefix) << "copyprotection error";
    }
  }

  if (!engine->IsRegistered()) {
    Output(Output::NoPrefix) << "registration error";
  }
}